

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void verb_prog_attach_weapon(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *ch_00;
  OBJ_DATA *in_RSI;
  long in_RDI;
  bool found;
  OBJ_DATA *finished;
  OBJ_DATA *pole;
  int in_stack_0000007c;
  OBJ_INDEX_DATA *in_stack_00000080;
  void *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  char cVar1;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  int vnum;
  char *format;
  
  cVar1 = '\0';
  format = *(char **)&in_RSI->item_type;
  do {
    if (format == (char *)0x0) {
LAB_0066a9de:
      if (cVar1 == '\0') {
        send_to_char(format,in_stack_ffffffffffffffd8);
      }
      else {
        act(format,in_stack_ffffffffffffffd8,(void *)CONCAT17(cVar1,in_stack_ffffffffffffffd0),
            in_stack_ffffffffffffffc8,0);
        vnum = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
        ch_00 = (CHAR_DATA *)(ulong)((int)*(short *)(*(long *)(in_RDI + 0x50) + 0x50) - 0x980);
        switch(ch_00) {
        case (CHAR_DATA *)0x0:
          obj_from_char(in_RSI);
          obj_from_char(in_RSI);
          extract_obj(in_RSI);
          extract_obj(in_RSI);
          get_obj_index(vnum);
          create_object(in_stack_00000080,in_stack_0000007c);
          obj_to_char((OBJ_DATA *)CONCAT17(cVar1,in_stack_ffffffffffffffd0),ch_00);
          break;
        case (CHAR_DATA *)0x1:
          obj_from_char(in_RSI);
          obj_from_char(in_RSI);
          extract_obj(in_RSI);
          extract_obj(in_RSI);
          get_obj_index(vnum);
          create_object(in_stack_00000080,in_stack_0000007c);
          obj_to_char((OBJ_DATA *)CONCAT17(cVar1,in_stack_ffffffffffffffd0),ch_00);
          break;
        case (CHAR_DATA *)0x2:
          obj_from_char(in_RSI);
          obj_from_char(in_RSI);
          extract_obj(in_RSI);
          extract_obj(in_RSI);
          get_obj_index(vnum);
          create_object(in_stack_00000080,in_stack_0000007c);
          obj_to_char((OBJ_DATA *)CONCAT17(cVar1,in_stack_ffffffffffffffd0),ch_00);
          break;
        case (CHAR_DATA *)0x3:
          obj_from_char(in_RSI);
          obj_from_char(in_RSI);
          extract_obj(in_RSI);
          extract_obj(in_RSI);
          get_obj_index(vnum);
          create_object(in_stack_00000080,in_stack_0000007c);
          obj_to_char((OBJ_DATA *)CONCAT17(cVar1,in_stack_ffffffffffffffd0),ch_00);
        }
      }
      return;
    }
    if (*(short *)(*(long *)(format + 0x50) + 0x50) == 0x97f) {
      cVar1 = '\x01';
      goto LAB_0066a9de;
    }
    format = *(char **)(format + 8);
  } while( true );
}

Assistant:

void verb_prog_attach_weapon(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *pole, *finished;
	bool found= false;

	for (pole = ch->carrying; pole != nullptr; pole = pole->next_content)
	{
		if (pole->pIndexData->vnum == 2431)
		{
			found = true;
			break;
		}
	}

	if (!found)
	{
		send_to_char("You don't have anything to attach it to!\n\r", ch);
		return;
	}

	act("You attach $p to a long wooden pole.", ch, obj, 0, TO_CHAR);

	switch (obj->pIndexData->vnum)
	{
		case 2432:
			obj_from_char(obj);
			obj_from_char(pole);

			extract_obj(obj);
			extract_obj(pole);

			finished = create_object(get_obj_index(2461), 18);

			obj_to_char(finished, ch);
			break;
		case 2433:
			obj_from_char(obj);
			obj_from_char(pole);

			extract_obj(obj);
			extract_obj(pole);

			finished = create_object(get_obj_index(2462), 18);

			obj_to_char(finished, ch);
			break;
		case 2434:
			obj_from_char(obj);
			obj_from_char(pole);

			extract_obj(obj);
			extract_obj(pole);

			finished = create_object(get_obj_index(2463), 18);

			obj_to_char(finished, ch);
			break;
		case 2435:
			obj_from_char(obj);
			obj_from_char(pole);

			extract_obj(obj);
			extract_obj(pole);

			finished = create_object(get_obj_index(2464), 18);

			obj_to_char(finished, ch);
			break;
	}
}